

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result wabt::anon_unknown_1::ResolveFuncTypes(Module *module,Errors *errors)

{
  bool bVar1;
  Result RVar2;
  reference base;
  FuncModuleField *pFVar3;
  EventModuleField *pEVar4;
  ImportModuleField *pIVar5;
  pointer pIVar6;
  FuncImport *pFVar7;
  iterator rhs;
  undefined1 local_108 [8];
  ExprVisitor visitor;
  ResolveFuncTypesExprVisitorDelegate delegate;
  EventImport *event_import;
  FuncImport *func_import;
  ImportModuleField *import_field;
  EventModuleField *event_field;
  FuncModuleField *func_field;
  FuncDeclaration *decl;
  Func *func;
  ModuleField *field;
  iterator __end2;
  iterator __begin2;
  ModuleFieldList *__range2;
  Errors *errors_local;
  Module *module_local;
  Result result;
  
  Result::Result((Result *)((long)&module_local + 4),Ok);
  join_0x00000010_0x00000000_ = intrusive_list<wabt::ModuleField>::begin(&module->fields);
  rhs = intrusive_list<wabt::ModuleField>::end(&module->fields);
  do {
    bVar1 = intrusive_list<wabt::ModuleField>::iterator::operator!=((iterator *)&__end2.node_,rhs);
    if (!bVar1) {
      return (Result)module_local._4_4_;
    }
    base = intrusive_list<wabt::ModuleField>::iterator::operator*((iterator *)&__end2.node_);
    decl = (FuncDeclaration *)0x0;
    pFVar3 = dyn_cast<wabt::FuncModuleField,wabt::ModuleField>(base);
    if (pFVar3 == (FuncModuleField *)0x0) {
      pEVar4 = dyn_cast<wabt::EventModuleField,wabt::ModuleField>(base);
      if (pEVar4 != (EventModuleField *)0x0) {
        func_field = (FuncModuleField *)&(pEVar4->event).decl;
        goto LAB_0029d3f9;
      }
      pIVar5 = dyn_cast<wabt::ImportModuleField,wabt::ModuleField>(base);
      if (pIVar5 != (ImportModuleField *)0x0) {
        pIVar6 = std::unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_>::get
                           (&pIVar5->import);
        pFVar7 = dyn_cast<wabt::FuncImport,wabt::Import>(pIVar6);
        if (pFVar7 == (FuncImport *)0x0) {
          pIVar6 = std::unique_ptr<wabt::Import,_std::default_delete<wabt::Import>_>::get
                             (&pIVar5->import);
          pFVar7 = (FuncImport *)dyn_cast<wabt::EventImport,wabt::Import>(pIVar6);
          if (pFVar7 == (FuncImport *)0x0) goto LAB_0029d4bd;
        }
        func_field = (FuncModuleField *)&(pFVar7->func).decl;
        goto LAB_0029d3f9;
      }
    }
    else {
      decl = (FuncDeclaration *)&pFVar3->func;
      func_field = (FuncModuleField *)&(pFVar3->func).decl;
LAB_0029d3f9:
      if (func_field != (FuncModuleField *)0x0) {
        ResolveFuncTypeWithEmptySignature(module,(FuncDeclaration *)func_field);
        ResolveImplicitlyDefinedFunctionType(&base->loc,module,(FuncDeclaration *)func_field);
        RVar2 = CheckFuncTypeVarMatchesExplicit
                          (&base->loc,module,(FuncDeclaration *)func_field,errors);
        Result::operator|=((Result *)((long)&module_local + 4),RVar2);
      }
      if (decl != (FuncDeclaration *)0x0) {
        ResolveFuncTypesExprVisitorDelegate::ResolveFuncTypesExprVisitorDelegate
                  ((ResolveFuncTypesExprVisitorDelegate *)
                   &visitor.expr_iter_stack_.
                    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,module,errors);
        ExprVisitor::ExprVisitor
                  ((ExprVisitor *)local_108,
                   (Delegate *)
                   &visitor.expr_iter_stack_.
                    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        RVar2 = ExprVisitor::VisitFunc((ExprVisitor *)local_108,(Func *)decl);
        Result::operator|=((Result *)((long)&module_local + 4),RVar2);
        ExprVisitor::~ExprVisitor((ExprVisitor *)local_108);
        ResolveFuncTypesExprVisitorDelegate::~ResolveFuncTypesExprVisitorDelegate
                  ((ResolveFuncTypesExprVisitorDelegate *)
                   &visitor.expr_iter_stack_.
                    super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
LAB_0029d4bd:
    intrusive_list<wabt::ModuleField>::iterator::operator++((iterator *)&__end2.node_);
  } while( true );
}

Assistant:

Result ResolveFuncTypes(Module* module, Errors* errors) {
  Result result = Result::Ok;
  for (ModuleField& field : module->fields) {
    Func* func = nullptr;
    FuncDeclaration* decl = nullptr;
    if (auto* func_field = dyn_cast<FuncModuleField>(&field)) {
      func = &func_field->func;
      decl = &func->decl;
    } else if (auto* event_field = dyn_cast<EventModuleField>(&field)) {
      decl = &event_field->event.decl;
    } else if (auto* import_field = dyn_cast<ImportModuleField>(&field)) {
      if (auto* func_import =
              dyn_cast<FuncImport>(import_field->import.get())) {
        // Only check the declaration, not the function itself, since it is an
        // import.
        decl = &func_import->func.decl;
      } else if (auto* event_import =
                     dyn_cast<EventImport>(import_field->import.get())) {
        decl = &event_import->event.decl;
      } else {
        continue;
      }
    } else {
      continue;
    }

    if (decl) {
      ResolveFuncTypeWithEmptySignature(*module, decl);
      ResolveImplicitlyDefinedFunctionType(field.loc, module, *decl);
      result |=
          CheckFuncTypeVarMatchesExplicit(field.loc, *module, *decl, errors);
    }

    if (func) {
      ResolveFuncTypesExprVisitorDelegate delegate(module, errors);
      ExprVisitor visitor(&delegate);
      result |= visitor.VisitFunc(func);
    }
  }
  return result;
}